

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fields.c
# Opt level: O3

void initUVP(double ***U,double ***V,double ***P,int imax,int jmax,double *init)

{
  uint sizeX;
  double dVar1;
  double **ppdVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double **ppdVar6;
  uint sizeY;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint sizeY_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  long lVar15;
  
  if (P != (double ***)0x0 && (V != (double ***)0x0 && U != (double ***)0x0)) {
    sizeX = imax + 2;
    sizeY_00 = jmax + 2;
    ppdVar6 = create2Dfield(sizeX,sizeY_00);
    *P = ppdVar6;
    ppdVar6 = create2Dfield(imax + 3U,sizeY_00);
    *U = ppdVar6;
    sizeY = jmax + 3;
    ppdVar6 = create2Dfield(sizeX,sizeY);
    *V = ppdVar6;
    auVar5 = _DAT_001328f0;
    auVar4 = _DAT_001328e0;
    if (init != (double *)0x0) {
      ppdVar2 = *P;
      uVar7 = (ulong)sizeY_00;
      if (-2 < imax && ppdVar2 != (double **)0x0) {
        dVar1 = init[2];
        lVar15 = uVar7 - 1;
        auVar10._8_4_ = (int)lVar15;
        auVar10._0_8_ = lVar15;
        auVar10._12_4_ = (int)((ulong)lVar15 >> 0x20);
        uVar8 = 0;
        auVar10 = auVar10 ^ _DAT_001328f0;
        do {
          pdVar3 = ppdVar2[uVar8];
          if (pdVar3 != (double *)0x0 && -2 < jmax) {
            uVar9 = 0;
            auVar12 = auVar4;
            do {
              auVar16 = auVar12 ^ auVar5;
              if ((bool)(~(auVar10._4_4_ < auVar16._4_4_ ||
                          auVar10._0_4_ < auVar16._0_4_ && auVar16._4_4_ == auVar10._4_4_) & 1)) {
                *(double *)((long)pdVar3 + uVar9) = dVar1;
              }
              if (auVar16._12_4_ <= auVar10._12_4_ &&
                  (auVar16._8_4_ <= auVar10._8_4_ || auVar16._12_4_ != auVar10._12_4_)) {
                *(double *)((long)pdVar3 + uVar9 + 8) = dVar1;
              }
              lVar15 = auVar12._8_8_;
              auVar12._0_8_ = auVar12._0_8_ + 2;
              auVar12._8_8_ = lVar15 + 2;
              uVar9 = uVar9 + 0x10;
            } while ((uVar7 * 8 + 8 & 0xfffffffffffffff0) != uVar9);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != sizeX);
      }
      auVar5 = _DAT_001328f0;
      auVar4 = _DAT_001328e0;
      ppdVar2 = *U;
      if (-3 < imax && ppdVar2 != (double **)0x0) {
        dVar1 = *init;
        lVar15 = uVar7 - 1;
        auVar16._8_4_ = (int)lVar15;
        auVar16._0_8_ = lVar15;
        auVar16._12_4_ = (int)((ulong)lVar15 >> 0x20);
        uVar8 = 0;
        auVar16 = auVar16 ^ _DAT_001328f0;
        do {
          pdVar3 = ppdVar2[uVar8];
          if (pdVar3 != (double *)0x0 && -2 < jmax) {
            uVar9 = 0;
            auVar13 = auVar4;
            do {
              auVar10 = auVar13 ^ auVar5;
              if ((bool)(~(auVar16._4_4_ < auVar10._4_4_ ||
                          auVar16._0_4_ < auVar10._0_4_ && auVar10._4_4_ == auVar16._4_4_) & 1)) {
                *(double *)((long)pdVar3 + uVar9) = dVar1;
              }
              if (auVar10._12_4_ <= auVar16._12_4_ &&
                  (auVar10._8_4_ <= auVar16._8_4_ || auVar10._12_4_ != auVar16._12_4_)) {
                *(double *)((long)pdVar3 + uVar9 + 8) = dVar1;
              }
              lVar15 = auVar13._8_8_;
              auVar13._0_8_ = auVar13._0_8_ + 2;
              auVar13._8_8_ = lVar15 + 2;
              uVar9 = uVar9 + 0x10;
            } while ((uVar7 * 8 + 8 & 0xfffffffffffffff0) != uVar9);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != imax + 3U);
      }
      auVar5 = _DAT_001328f0;
      auVar4 = _DAT_001328e0;
      if (ppdVar6 != (double **)0x0 && -2 < imax) {
        dVar1 = init[1];
        lVar15 = (ulong)sizeY - 1;
        auVar11._8_4_ = (int)lVar15;
        auVar11._0_8_ = lVar15;
        auVar11._12_4_ = (int)((ulong)lVar15 >> 0x20);
        uVar7 = 0;
        auVar11 = auVar11 ^ _DAT_001328f0;
        do {
          pdVar3 = ppdVar6[uVar7];
          if (pdVar3 != (double *)0x0 && -3 < jmax) {
            uVar8 = 0;
            auVar14 = auVar4;
            do {
              auVar10 = auVar14 ^ auVar5;
              if ((bool)(~(auVar11._4_4_ < auVar10._4_4_ ||
                          auVar11._0_4_ < auVar10._0_4_ && auVar10._4_4_ == auVar11._4_4_) & 1)) {
                *(double *)((long)pdVar3 + uVar8) = dVar1;
              }
              if (auVar10._12_4_ <= auVar11._12_4_ &&
                  (auVar10._8_4_ <= auVar11._8_4_ || auVar10._12_4_ != auVar11._12_4_)) {
                *(double *)((long)pdVar3 + uVar8 + 8) = dVar1;
              }
              lVar15 = auVar14._8_8_;
              auVar14._0_8_ = auVar14._0_8_ + 2;
              auVar14._8_8_ = lVar15 + 2;
              uVar8 = uVar8 + 0x10;
            } while (((ulong)sizeY * 8 + 8 & 0xfffffffffffffff0) != uVar8);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != sizeX);
      }
    }
  }
  return;
}

Assistant:

void initUVP (REAL ***U, REAL ***V, REAL ***P, int imax, int jmax, REAL *init)
{
	if (!U || !V || !P)
		return;
	*P = create2Dfield(imax+2,jmax+2);
	*U = create2Dfield(imax+3,jmax+2);
	*V = create2Dfield(imax+2,jmax+3);
	if (!init)
		return;
	fill2Dfield(init[2],*P,imax+2,jmax+2);
	fill2Dfield(init[0],*U,imax+3,jmax+2);
	fill2Dfield(init[1],*V,imax+2,jmax+3);
	return;
}